

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Alt(Compiler *this,Frag a,Frag b)

{
  Inst *pIVar1;
  Frag FVar2;
  PatchList PVar3;
  uint uVar4;
  byte bVar5;
  PatchList PVar6;
  ulong uVar7;
  uint32_t out;
  uint local_78;
  uint32_t uStack_74;
  uint32_t uStack_70;
  int iStack_6c;
  uint32_t uStack_5c;
  
  uStack_5c = b.end.head;
  out = a.begin;
  local_78 = b.begin;
  if (out == 0) {
    uStack_70 = b.end.tail;
    iStack_6c = b._12_4_;
    uStack_74 = uStack_5c;
  }
  else {
    uStack_74 = a.end.head;
    if (local_78 == 0) {
      uStack_70 = a.end.tail;
      iStack_6c = a._12_4_;
      local_78 = out;
    }
    else {
      uVar4 = AllocInst(this,1);
      if ((int)uVar4 < 0) {
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0;
        iStack_6c = (uint)iStack_6c._1_3_ << 8;
      }
      else {
        Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                            .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar4,
                            out,local_78);
        PVar3 = b.end;
        PVar6 = PVar3;
        if ((((undefined1  [16])a & (undefined1  [16])0xffffffff00000000) == (undefined1  [16])0x0)
           || (PVar6 = a.end, uStack_5c == 0)) {
          uStack_74 = PVar6.head;
        }
        else {
          pIVar1 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
          uVar7 = (ulong)a.end >> 0x21;
          if (((undefined1  [16])a & (undefined1  [16])0x0) == (undefined1  [16])0x0) {
            pIVar1[uVar7].out_opcode_ = pIVar1[uVar7].out_opcode_ & 0xf | uStack_5c << 4;
            PVar6 = PVar3;
          }
          else {
            pIVar1[uVar7].field_1.out1_ = uStack_5c;
            PVar6 = PVar3;
          }
        }
        uStack_70 = PVar6.tail;
        bVar5 = 1;
        if (((undefined1  [16])a & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
          bVar5 = b.nullable & 1;
        }
        iStack_6c = CONCAT31(iStack_6c._1_3_,bVar5);
        local_78 = uVar4;
      }
    }
  }
  FVar2.end.head = uStack_74;
  FVar2.begin = local_78;
  FVar2.end.tail = uStack_70;
  FVar2._12_4_ = iStack_6c;
  return FVar2;
}

Assistant:

Frag Compiler::Alt(Frag a, Frag b) {
  // Special case for convenience in loops.
  if (IsNoMatch(a))
    return b;
  if (IsNoMatch(b))
    return a;

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();

  inst_[id].InitAlt(a.begin, b.begin);
  return Frag(id, PatchList::Append(inst_.data(), a.end, b.end),
              a.nullable || b.nullable);
}